

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitstreamDecoder.cpp
# Opt level: O3

void scan_bitstream_mfm_fm(TrackData *trackdata)

{
  ostream *poVar1;
  pointer puVar2;
  int *piVar3;
  int *piVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  bool bVar9;
  uint16_t uVar10;
  ushort uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  BitBuffer *pBVar17;
  LogHelper *pLVar18;
  pointer pSVar19;
  Encoding EVar20;
  int iVar21;
  Sector *this;
  uint uVar22;
  EVP_PKEY_CTX *ctx;
  uint uVar23;
  ulong uVar24;
  ulong uVar25;
  int *piVar26;
  uint uVar27;
  long lVar28;
  bool bVar29;
  CRC16 crc;
  uint8_t am;
  int am_offset;
  array<unsigned_char,_6UL> id;
  Header header;
  Sector s;
  vector<std::pair<int,_Encoding>,_std::allocator<std::pair<int,_Encoding>_>_> data_fields;
  Track track;
  CRC16 local_1ac;
  byte local_1a9;
  undefined8 local_1a8;
  uint16_t local_19a;
  BitBuffer *local_198;
  int local_190;
  char local_18b;
  array<unsigned_char,_6UL> local_18a;
  uint local_184;
  Encoding *local_180;
  Sector *local_178;
  Sector *local_170;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_168;
  int local_14c;
  undefined1 local_148 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  _Base_ptr p_Stack_128;
  vector<Data,_std::allocator<Data>_> local_120;
  undefined1 local_108 [32];
  _Base_ptr p_Stack_e8;
  pointer local_e0;
  TrackData *local_d8;
  int *local_d0;
  uint local_c8;
  uint local_c4;
  int local_c0;
  uint local_bc;
  int *local_b8;
  int *piStack_b0;
  long local_a8;
  Track local_98;
  ulong local_78;
  int *local_70;
  int *local_68;
  _Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
  local_60;
  
  Track::Track(&local_98,0);
  bVar29 = opt.a1sync == 0;
  local_d8 = trackdata;
  pBVar17 = TrackData::bitstream(trackdata);
  BitBuffer::seek(pBVar17,0);
  local_98.tracklen = BitBuffer::track_bitsize(pBVar17);
  CRC16::CRC16(&local_1ac,0xffff);
  uVar27 = -(uint)bVar29 | 0xffdfffdf;
  local_b8 = (int *)0x0;
  piStack_b0 = (int *)0x0;
  local_a8 = 0;
  local_180 = &pBVar17->encoding;
  local_1a8 = (Sector *)((ulong)local_1a8._4_4_ << 0x20);
  uVar23 = 0;
  local_198 = pBVar17;
LAB_0013a85b:
  do {
    bVar29 = BitBuffer::wrapped(local_198);
    this = local_98.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
           super__Vector_impl_data._M_start;
    if ((bVar29) ||
       ((iVar12 = Track::size(&local_98), iVar12 == 0 &&
        (iVar12 = BitBuffer::tell(local_198),
        this = local_98.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>._M_impl.
               super__Vector_impl_data._M_start, local_98.tracklen < iVar12)))) {
      do {
        do {
          do {
            if (this == local_98.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>.
                        _M_impl.super__Vector_impl_data._M_finish) {
              TrackData::add(local_d8,&local_98);
              if (local_b8 != (int *)0x0) {
                operator_delete(local_b8,local_a8 - (long)local_b8);
              }
              std::vector<Sector,_std::allocator<Sector>_>::~vector(&local_98.m_sectors);
              return;
            }
            local_184 = this->encoding == FM | 4;
            iVar12 = 7 << (sbyte)local_184;
            uVar23 = iVar12 + 0x290;
            if (this->datarate != _1M) {
              uVar23 = iVar12 + 0x160;
            }
            local_78 = (ulong)uVar23;
            local_1a8 = this;
            local_178 = local_98.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            bVar29 = Sector::has_badidcrc(this);
            this = local_1a8 + 1;
            local_170 = this;
          } while (bVar29);
          if (opt.debug != 0) {
            pLVar18 = util::operator<<((LogHelper *)&util::cout,
                                       (char (*) [22])"  s_b_mfm_fm finding ");
            pLVar18 = util::operator<<(pLVar18,&local_d8->cylhead);
            pLVar18 = util::operator<<(pLVar18,(char (*) [9])0x1b0f43);
            pLVar18 = util::operator<<(pLVar18,&(local_1a8->header).sector);
            util::operator<<(pLVar18,(char (*) [3])0x1ad421);
          }
          local_d0 = local_b8;
          this = local_170;
        } while (local_b8 == piStack_b0);
        local_c0 = (int)local_78 + 0x170;
        local_18b = local_170 != local_178;
        local_70 = &local_1a8->gap3;
        do {
          piVar3 = local_d0;
          pBVar17 = local_198;
          piVar4 = local_d0 + 2;
          piVar26 = piVar4;
          if (piVar4 == piStack_b0) {
            piVar26 = local_b8;
          }
          if (local_d0[1] == local_1a8->encoding) {
            iVar12 = *local_d0;
            local_d0 = piVar4;
            iVar13 = BitBuffer::track_offset(local_198,iVar12);
            iVar12 = 0;
            if (iVar13 < local_1a8->offset) {
              iVar12 = local_98.tracklen;
            }
            iVar12 = iVar12 + (iVar13 - local_1a8->offset);
            piVar4 = local_d0;
            if (((int)local_78 <= iVar12) && (iVar12 <= local_c0)) {
              BitBuffer::seek(pBVar17,*piVar3);
              pBVar17->encoding = piVar3[1];
              bVar5 = BitBuffer::read_byte(pBVar17);
              ctx = (EVP_PKEY_CTX *)0xffff;
              if (piVar3[1] == 1) {
                ctx = (EVP_PKEY_CTX *)0xcdb4;
              }
              CRC16::init(&local_1ac,ctx);
              local_bc = (uint)bVar5;
              CRC16::add(&local_1ac,local_bc);
              if ((bVar5 == 0xfd) && (piVar3[1] == 2)) {
                local_1a8->encoding = RX02;
                piVar4 = &(local_1a8->header).size;
                *piVar4 = *piVar4 + 1;
                *local_180 = MFM;
                local_184 = 4;
              }
              pSVar19 = local_170;
              if (local_170 == local_178) {
                pSVar19 = local_98.m_sectors.super__Vector_base<Sector,_std::allocator<Sector>_>.
                          _M_impl.super__Vector_impl_data._M_start;
              }
              iVar14 = 0;
              iVar21 = pSVar19->offset - iVar13;
              iVar12 = 0;
              if (iVar21 == 0 || pSVar19->offset < iVar13) {
                iVar12 = local_98.tracklen;
              }
              uVar23 = iVar21 + iVar12;
              local_14c = (int)uVar23 >> ((byte)local_184 & 0x1f);
              local_c4 = -1 << ((byte)local_184 & 0x1f);
              iVar12 = *piVar26;
              iVar13 = *piVar3;
              if (iVar12 <= iVar13) {
                iVar14 = BitBuffer::size(pBVar17);
                iVar13 = *piVar3;
              }
              local_68 = piVar3;
              lVar28 = (long)local_14c;
              iVar21 = (int)(lVar28 + -1);
              iVar12 = ((iVar14 + iVar12) - iVar13 >> ((byte)local_184 & 0x1f)) + -1;
              if (opt.gap2 == 0) {
                iVar12 = iVar21;
              }
              if (local_170 == local_178) {
                iVar12 = iVar21;
              }
              iVar13 = iVar12 + -3;
              if (local_1a8->encoding != MFM) {
                iVar13 = iVar12;
              }
              if (iVar12 < 3) {
                iVar13 = iVar12;
              }
              local_c8 = uVar23;
              iVar14 = Sector::size(local_1a8);
              iVar14 = iVar14 + 2;
              iVar12 = iVar13;
              if (iVar13 < iVar14) {
                iVar12 = iVar14;
              }
              iVar15 = BitBuffer::remaining(local_198);
              iVar15 = iVar15 >> ((byte)local_184 & 0x1f);
              if (iVar15 < iVar14) {
                iVar16 = Sector::copies(local_1a8);
                if ((iVar16 != 0) &&
                   (bVar29 = Sector::is_8k_sector(local_1a8), iVar15 < 0x1802 || !bVar29)) {
                  piVar4 = local_d0;
                  if (opt.debug != 0) {
                    util::operator<<((LogHelper *)&util::cout,
                                     (char (*) [45])"  s_b_mfm_fm ignoring truncated sector copy\n")
                    ;
                    piVar4 = local_d0;
                  }
                  goto LAB_0013b775;
                }
                if (opt.debug != 0) {
                  util::operator<<((LogHelper *)&util::cout,
                                   (char (*) [55])
                                   "  s_b_mfm_fm using truncated sector data as only copy\n");
                }
              }
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                        (&local_168,(long)iVar12,(allocator_type *)local_148);
              BitBuffer::read<Data>(local_198,(Data *)&local_168);
              local_19a = CRC16::add(&local_1ac,
                                     local_168.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start,(long)iVar14);
              if ((local_19a != 0) && (opt.debug != 0)) {
                iVar12 = Sector::size(local_1a8);
                bVar5 = local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start[iVar12];
                iVar12 = Sector::size(local_1a8);
                bVar6 = local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start[(long)iVar12 + 1];
                bVar7 = CRC16::msb(&local_1ac);
                bVar8 = CRC16::lsb(&local_1ac);
                util::fmt_abi_cxx11_
                          ((string *)local_148,
                           "  s_b_mfm_fm bad data CRC: %02X %02X, expected %02X %02X\n",(ulong)bVar5
                           ,(ulong)bVar6,(ulong)bVar7,(ulong)bVar8);
                util::operator<<((LogHelper *)&util::cout,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_148);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_148._0_8_ != &local_138) {
                  operator_delete((void *)local_148._0_8_,local_138._M_allocated_capacity + 1);
                }
              }
              if ((opt.keepoverlap == 0) && (iVar12 = Sector::size(local_1a8), iVar13 < iVar12)) {
LAB_0013b386:
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&local_168,(long)iVar13);
              }
              else {
                iVar12 = (int)local_168.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish;
                puVar2 = local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                iVar13 = Sector::size(local_1a8);
                if ((iVar13 < iVar12 - (int)puVar2) &&
                   ((opt.gaps == 0 || ((local_170 == local_178 && (opt.gap4b == 0)))))) {
                  iVar13 = Sector::size(local_1a8);
                  goto LAB_0013b386;
                }
              }
              iVar12 = local_14c + 6;
              iVar13 = (int)local_168.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                       (int)local_168.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start;
              if (iVar13 < iVar12) {
                bVar29 = false;
              }
              else {
                bVar29 = true;
                if (((local_c8 & ~local_c4) == 0) &&
                   (local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar28 + -1] == 0xfe)) {
                  bVar29 = test_remove_gap2((Data *)&local_168,iVar12);
                }
              }
              if (iVar13 < iVar14) {
                bVar9 = false;
              }
              else if (local_170 == local_178) {
                bVar9 = test_remove_gap4b((Data *)&local_168,iVar14);
              }
              else {
                bVar9 = test_remove_gap3((Data *)&local_168,iVar14,local_70);
              }
              if (opt.gaps != 2) {
                if ((iVar12 <= iVar13 & bVar29) == 1) {
                  if (opt.debug != 0) {
                    util::operator<<((LogHelper *)&util::cout,
                                     (char (*) [33])"  s_b_mfm_fm removing gap2 data\n");
                  }
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_168,
                             (long)(int)(iVar21 + -3 + (uint)(local_1a8->encoding != MFM) * 3));
                }
                else if (opt.debug != 0 && iVar12 <= iVar13) {
                  util::operator<<((LogHelper *)&util::cout,
                                   (char (*) [36])"  s_b_mfm_fm skipping gap2 removal\n");
                }
                if ((iVar14 <= iVar13) && (((bVar29 | iVar13 < iVar12) & bVar9) != 0)) {
                  if (local_170 == local_178) {
                    if (opt.debug != 0) {
                      util::operator<<((LogHelper *)&util::cout,
                                       (char (*) [34])"  s_b_mfm_fm removing gap4b data\n");
                    }
                  }
                  else if (opt.debug != 0) {
                    util::operator<<((LogHelper *)&util::cout,
                                     (char (*) [33])"  s_b_mfm_fm removing gap3 data\n");
                  }
                  iVar12 = Sector::size(local_1a8);
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                            (&local_168,(long)iVar12);
                }
              }
              local_148._8_4_ = _S_red;
              local_138._M_allocated_capacity = 0;
              local_138._8_8_ = local_148 + 8;
              local_120.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              p_Stack_128 = (_Base_ptr)local_138._8_8_;
              bVar29 = Sector::is_8k_sector(local_1a8);
              if (bVar29) {
                ChecksumMethods((set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
                                 *)local_108,
                                local_168.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (int)local_168.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                                (int)local_168.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
                std::
                _Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
                ::clear((_Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
                         *)local_148);
                if (local_108._16_8_ != 0) {
                  local_148._8_4_ = local_108._8_4_;
                  local_138._M_allocated_capacity = local_108._16_8_;
                  local_138._8_8_ = local_108._24_8_;
                  p_Stack_128 = p_Stack_e8;
                  *(undefined1 **)(local_108._16_8_ + 8) = local_148 + 8;
                  local_120.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                  super__Vector_impl_data._M_start = local_e0;
                  local_108._16_8_ = 0;
                  local_108._24_8_ = local_108 + 8;
                  local_e0 = (pointer)0x0;
                  p_Stack_e8 = (_Base_ptr)local_108._24_8_;
                }
                std::
                _Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
                ::~_Rb_tree((_Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
                             *)local_108);
                if (opt.debug != 0) {
                  pLVar18 = util::operator<<((LogHelper *)&util::cout,
                                             (char (*) [29])"  s_b_mfm_fm chk8k_method = ");
                  std::
                  _Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
                  ::_Rb_tree(&local_60,
                             (_Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
                              *)local_148);
                  ChecksumName_abi_cxx11_
                            ((string *)local_108,
                             (set<ChecksumType,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
                              *)&local_60);
                  pLVar18 = util::operator<<(pLVar18,(string *)local_108);
                  local_18a._M_elems[0] = 10;
                  util::operator<<(pLVar18,(char *)&local_18a);
                  if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
                    operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
                  }
                  std::
                  _Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
                  ::~_Rb_tree(&local_60);
                }
              }
              piVar4 = local_68;
              if ((local_19a == 0 && local_18b == '\0') &&
                 (iVar12 = BitBuffer::track_offset
                                     (local_198,(iVar14 << ((byte)local_184 & 0x1f)) + *local_68),
                 iVar12 < *piVar4)) {
                iVar13 = BitBuffer::splicepos(local_198);
                if (iVar13 < iVar12) {
                  iVar13 = iVar12;
                }
                BitBuffer::splicepos(local_198,iVar13);
              }
              Sector::add(local_1a8,(Data *)&local_168,local_19a != 0,(uint8_t)local_bc);
              bVar29 = local_19a == 0;
              bVar9 = local_120.super__Vector_base<Data,_std::allocator<Data>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0;
              std::
              _Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
              ::~_Rb_tree((_Rb_tree<ChecksumType,_ChecksumType,_std::_Identity<ChecksumType>,_std::less<ChecksumType>,_std::allocator<ChecksumType>_>
                           *)local_148);
              if (local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start != (uint8_t *)0x0) {
                operator_delete(local_168.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_168.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_168.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              this = local_170;
              piVar4 = local_d0;
              if (bVar29 || bVar9) break;
            }
          }
LAB_0013b775:
          local_d0 = piVar4;
          this = local_170;
        } while (local_d0 != piStack_b0);
      } while( true );
    }
    bVar5 = BitBuffer::read1(local_198);
    uVar23 = (uint)bVar5 | uVar23 * 2;
    if ((uVar23 & uVar27) != 0x44894489) goto LAB_0013a8d6;
    uVar10 = BitBuffer::read16(local_198);
  } while ((uVar10 & uVar27) != 0x4489);
  uVar11 = 0xcdb4;
  EVar20 = MFM;
  goto LAB_0013a93e;
LAB_0013a8d6:
  if (opt.encoding != MFM) {
    if ((int)uVar23 < -0x55ddd576) {
      if ((0x22 < uVar23 + 0x55ddd778) ||
         ((0x500000005U >> ((ulong)(uVar23 + 0x55ddd778) & 0x3f) & 1) == 0)) goto LAB_0013a85b;
    }
    else if (((uVar23 != 0xaa222a8a) && (uVar23 != 0xaa2a2a88)) && (uVar23 != 0xaa222aa8))
    goto LAB_0013a85b;
    iVar12 = BitBuffer::tell(local_198);
    BitBuffer::seek(local_198,iVar12 + -0x20);
    uVar11 = 0xffff;
    EVar20 = FM;
LAB_0013a93e:
    *local_180 = EVar20;
    CRC16::init(&local_1ac,(EVP_PKEY_CTX *)(ulong)uVar11);
    pBVar17 = local_198;
    local_190 = BitBuffer::tell(local_198);
    local_1a9 = BitBuffer::read_byte(pBVar17);
    CRC16::add(&local_1ac,(uint)local_1a9);
    uVar22 = (uint)local_1a9;
    switch(local_1a9) {
    case 0xf8:
    case 0xf9:
    case 0xfa:
    case 0xfb:
    case 0xfd:
      EVar20 = *local_180;
      if (EVar20 == FM) {
        if ((byte)local_1a8 != -2) break;
      }
      else {
        uVar22 = (uint)local_1a8;
      }
      if (opt.debug != 0) {
        pLVar18 = util::operator<<((LogHelper *)&util::cout,(char (*) [12])"s_b_mfm_fm ");
        pLVar18 = util::operator<<(pLVar18,local_180);
        pLVar18 = util::operator<<(pLVar18,(char (*) [10])0x1ab6e1);
        pLVar18 = util::operator<<(pLVar18,&local_1a9);
        pLVar18 = util::operator<<(pLVar18,(char (*) [13])") at offset ");
        pLVar18 = util::operator<<(pLVar18,&local_190);
        pLVar18 = util::operator<<(pLVar18,(char (*) [3])0x1ae468);
        iVar12 = BitBuffer::track_offset(local_198,local_190);
        local_148._0_4_ = iVar12;
        pLVar18 = util::operator<<(pLVar18,(int *)local_148);
        util::operator<<(pLVar18,(char (*) [3])0x1af6ac);
        EVar20 = *local_180;
      }
      local_148._4_4_ = EVar20;
      local_148._0_4_ = local_190;
      std::vector<std::pair<int,Encoding>,std::allocator<std::pair<int,Encoding>>>::
      emplace_back<std::pair<int,Encoding>>
                ((vector<std::pair<int,Encoding>,std::allocator<std::pair<int,Encoding>>> *)
                 &local_b8,(pair<int,_Encoding> *)local_148);
      local_1a8 = (Sector *)CONCAT44(local_1a8._4_4_,uVar22);
      break;
    case 0xfc:
      if (opt.debug != 0) {
        pLVar18 = util::operator<<((LogHelper *)&util::cout,(char (*) [12])"s_b_mfm_fm ");
        pLVar18 = util::operator<<(pLVar18,local_180);
        pLVar18 = util::operator<<(pLVar18,(char (*) [16])" IAM at offset ");
        pLVar18 = util::operator<<(pLVar18,&local_190);
        pLVar18 = util::operator<<(pLVar18,(char (*) [3])0x1ae468);
        iVar12 = BitBuffer::track_offset(local_198,local_190);
        local_148._0_4_ = iVar12;
        pLVar18 = util::operator<<(pLVar18,(int *)local_148);
        util::operator<<(pLVar18,(char (*) [3])0x1af6ac);
      }
      break;
    case 0xfe:
      BitBuffer::read<std::array<unsigned_char,6ul>>(local_198,&local_18a);
      CRC16::add(&local_1ac,&local_18a,6);
      uVar10 = CRC16::operator_cast_to_unsigned_short(&local_1ac);
      if ((uVar10 == 0) || ((opt.idcrc == 1 && (*local_180 != FM)))) {
        Header::Header((Header *)&local_168,(uint)local_18a._M_elems[0],(uint)local_18a._M_elems[1],
                       (uint)local_18a._M_elems[2],(uint)local_18a._M_elems[3]);
        Sector::Sector((Sector *)local_148,local_198->datarate,local_198->encoding,
                       (Header *)&local_168,0);
        uVar10 = CRC16::operator_cast_to_unsigned_short(&local_1ac);
        Sector::set_badidcrc((Sector *)local_148,uVar10 != 0);
        iVar12 = BitBuffer::track_offset(local_198,local_190);
        local_138._8_4_ = iVar12;
        if (opt.debug != 0) {
          pLVar18 = util::operator<<((LogHelper *)&util::cout,(char (*) [12])"s_b_mfm_fm ");
          pLVar18 = util::operator<<(pLVar18,local_180);
          pLVar18 = util::operator<<(pLVar18,(char (*) [11])0x1ab4ed);
          pLVar18 = util::operator<<(pLVar18,(int *)&local_168.
                                                                                                          
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish);
          pLVar18 = util::operator<<(pLVar18,(char (*) [13])") at offset ");
          pLVar18 = util::operator<<(pLVar18,&local_190);
          pLVar18 = util::operator<<(pLVar18,(char (*) [3])0x1ae468);
          pLVar18 = util::operator<<(pLVar18,(int *)(local_138._M_local_buf + 8));
          util::operator<<(pLVar18,(char (*) [3])0x1af6ac);
        }
        Track::add(&local_98,(Sector *)local_148);
        if ((opt.debug != 0) &&
           (uVar10 = CRC16::operator_cast_to_unsigned_short(&local_1ac), uVar10 != 0)) {
          uVar25 = (ulong)local_18a._M_elems[4];
          uVar24 = (ulong)local_18a._M_elems[5];
          bVar5 = CRC16::msb(&local_1ac);
          bVar6 = CRC16::lsb(&local_1ac);
          util::fmt_abi_cxx11_
                    ((string *)local_108,"  s_b_mfm_fm bad id CRC: %02X %02X, expected %02X %02X\n",
                     uVar25,uVar24,(ulong)bVar5,(ulong)bVar6);
          util::operator<<((LogHelper *)&util::cout,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_108);
          if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
            operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
          }
        }
        bVar5 = local_1a9;
        if (*local_180 != FM) {
          bVar5 = (byte)local_1a8;
        }
        local_1a8 = (Sector *)CONCAT44(local_1a8._4_4_,(uint)bVar5);
        std::vector<Data,_std::allocator<Data>_>::~vector(&local_120);
      }
      break;
    default:
      if (opt.debug != 0) {
        pLVar18 = util::operator<<((LogHelper *)&util::cout,(char (*) [20])"s_b_mfm_fm unknown ");
        pLVar18 = util::operator<<(pLVar18,local_180);
        pLVar18 = util::operator<<(pLVar18,(char (*) [6])0x1ae465);
        if (pLVar18->clearline == true) {
          pLVar18->clearline = false;
          util::operator<<(pLVar18,clearline);
        }
        poVar1 = pLVar18->screen;
        *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
             *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
        poVar1 = pLVar18->file;
        if ((poVar1 != (ostream *)0x0) && (pLVar18->statusmsg == false)) {
          *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
               *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
        }
        pLVar18 = util::operator<<(pLVar18,&local_1a9);
        if (pLVar18->clearline == true) {
          pLVar18->clearline = false;
          util::operator<<(pLVar18,clearline);
        }
        poVar1 = pLVar18->screen;
        *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
             *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
        poVar1 = pLVar18->file;
        if ((poVar1 != (ostream *)0x0) && (pLVar18->statusmsg == false)) {
          *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
               *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
        }
        pLVar18 = util::operator<<(pLVar18,(char (*) [13])") at offset ");
        pLVar18 = util::operator<<(pLVar18,&local_190);
        pLVar18 = util::operator<<(pLVar18,(char (*) [5])0x1b1c6b);
        pLVar18 = util::operator<<(pLVar18,&local_d8->cylhead);
        util::operator<<(pLVar18,(char (*) [2])0x1ad40e);
      }
    }
  }
  goto LAB_0013a85b;
}

Assistant:

void scan_bitstream_mfm_fm(TrackData& trackdata)
{
    Track track;
    uint32_t sync_mask = opt.a1sync ? 0xffdfffdf : 0xffffffff;

    auto& bitbuf = trackdata.bitstream();
    bitbuf.seek(0);
    track.tracklen = bitbuf.track_bitsize();

    CRC16 crc;
    std::vector<std::pair<int, Encoding>> data_fields;

    uint32_t dword = 0;
    uint8_t last_fm_am = 0;

    while (!bitbuf.wrapped())
    {
        // Give up if no headers were found in the first revolution
        if (!track.size() && bitbuf.tell() > track.tracklen)
            break;

        dword = (dword << 1) | bitbuf.read1();

        if ((dword & sync_mask) == 0x44894489)
        {
            if ((bitbuf.read16() & sync_mask) != 0x4489) continue;

            bitbuf.encoding = Encoding::MFM;
            crc.init(CRC16::A1A1A1);
        }
        else if (opt.encoding == Encoding::MFM) // FM disabled?
            continue;
        else
        {
            // Check for known FM address marks
            switch (dword)
            {
            case 0xaa222888:    // F8/C7 DDAM
            case 0xaa22288a:    // F9/C7 Alt-DDAM
            case 0xaa2228a8:    // FA/C7 Alt-DAM
            case 0xaa2228aa:    // FB/C7 DAM
            case 0xaa2a2a88:    // FC/D7 IAM
            case 0xaa222a8a:    // FD/C7 RX02 DAM
            case 0xaa222aa8:    // FE/C7 IDAM
                break;

                // Not a recognised FM mark, so keep searching
            default:
                continue;
            }

            // With FM the address mark is also the sync, so step back to read it again
            bitbuf.seek(bitbuf.tell() - 32);

            bitbuf.encoding = Encoding::FM;
            crc.init();
        }

        auto am_offset = bitbuf.tell();
        auto am = bitbuf.read_byte();
        crc.add(am);

        switch (am)
        {
        case 0xfe:  // IDAM
        {
            std::array<uint8_t, 6> id;  // CHRN + 16-bit CRC
            bitbuf.read(id);

            // Check header CRC, skipping if it's bad, unless the user wants it.
            // Don't allow FM sectors with ID CRC errors, due to the false-positive risk.
            crc.add(id.data(), id.size());
            if (!crc || (opt.idcrc == 1 && bitbuf.encoding != Encoding::FM))
            {
                Header header(id[0], id[1], id[2], id[3]);
                Sector s(bitbuf.datarate, bitbuf.encoding, header);
                s.set_badidcrc(crc != 0);
                s.offset = bitbuf.track_offset(am_offset);

                if (opt.debug)
                    util::cout << "s_b_mfm_fm " << bitbuf.encoding << " IDAM (id=" << header.sector << ") at offset " << am_offset << " (" << s.offset << ")\n";
                track.add(std::move(s));

                if (opt.debug && crc != 0)
                {
                    util::cout << util::fmt("  s_b_mfm_fm bad id CRC: %02X %02X, expected %02X %02X\n",
                        id[4], id[5], crc.msb(), crc.lsb());
                }

                if (bitbuf.encoding == Encoding::FM)
                    last_fm_am = am;
            }
            break;
        }

        case 0xfb: case 0xfa:   // normal data (+alt)
        case 0xf8: case 0xf9:   // deleted data (+alt)
        case 0xfd:              // RX02
        {
            // FM address marks are short, so false positives are likely.
            if (bitbuf.encoding == Encoding::FM)
            {
                // Require a valid FM IDAM before we accept an FM DAM.
                if (last_fm_am != 0xfe)
                    break;

                last_fm_am = am;
            }

            if (opt.debug)
                util::cout << "s_b_mfm_fm " << bitbuf.encoding << " DAM (am=" << am << ") at offset " << am_offset << " (" << bitbuf.track_offset(am_offset) << ")\n";
            data_fields.push_back(std::make_pair(am_offset, bitbuf.encoding));
            break;
        }

        case 0xfc:  // IAM
            if (opt.debug)
                util::cout << "s_b_mfm_fm " << bitbuf.encoding << " IAM at offset " << am_offset << " (" << bitbuf.track_offset(am_offset) << ")\n";
            break;

        default:
            if (opt.debug)
                util::cout << "s_b_mfm_fm unknown " << bitbuf.encoding << " AM (" << std::hex << am << std::dec << ") at offset " << am_offset << " on " << trackdata.cylhead << "\n";
            break;
        }
    }

    // Process each sector header to look for an associated data field
    for (auto it = track.begin(); it != track.end(); ++it)
    {
        auto& sector = *it;
        auto final_sector = std::next(it) == track.end();

        auto shift = (sector.encoding == Encoding::FM) ? 5 : 4;
        auto gap2_size = (sector.datarate == DataRate::_1M) ? GAP2_MFM_ED : GAP2_MFM_DDHD;  // gap2 size in MFM bytes (FM is half size but double encoding overhead)
        auto min_distance = ((1 + 6) << shift) + (gap2_size << 4);          // AM, ID, gap2 (fixed shift as FM is half size)
        auto max_distance = ((1 + 6) << shift) + ((23 + gap2_size) << 4);       // 1=AM, 6=ID, 21+gap2=max WD177x offset (gap2 may be longer when formatted by different type of controller)

        // If the header has a CRC error, the data can't be reached
        if (sector.has_badidcrc())
            continue;

        if (opt.debug)
            util::cout << "  s_b_mfm_fm finding " << trackdata.cylhead << " sector " << sector.header.sector << ":\n";

        for (auto itData = data_fields.begin(); itData != data_fields.end(); ++itData)
        {
            const auto& dam_offset = itData->first;
            const Encoding& data_encoding = itData->second;
            auto itDataNext = (std::next(itData) == data_fields.end()) ? data_fields.begin() : std::next(itData);

            // Data field must be the same encoding type
            if (data_encoding != sector.encoding)
                continue;

            // Determine distance from header to data field, taking care of track wrapping
            auto dam_track_offset = bitbuf.track_offset(dam_offset);
            auto distance = ((dam_track_offset < sector.offset) ? track.tracklen : 0) + dam_track_offset - sector.offset;

            // Reject if the data field is too close or too far away
            if (distance < min_distance || distance > max_distance)
                continue;

            bitbuf.seek(dam_offset);
            bitbuf.encoding = data_encoding;

            auto dam = bitbuf.read_byte();
            crc.init((data_encoding == Encoding::MFM) ? CRC16::A1A1A1 : CRC16::INIT_CRC);
            crc.add(dam);

            // RX02 modified MFM uses an FM DAM followed by MFM data and CRC.
            if (data_encoding == Encoding::FM && dam == 0xfd)
            {
                // Convert the sector to RX02, its size to match the data.
                sector.encoding = Encoding::RX02;
                ++sector.header.size;

                // Switch to decoding the data as MFM.
                bitbuf.encoding = Encoding::MFM;
                shift = 4;
            }

            // Determine the offset and distance to the next IDAM, taking care of track wrap if it's the final sector
            auto next_idam_offset = final_sector ? track.begin()->offset : std::next(it)->offset;
            auto next_idam_distance = ((next_idam_offset <= dam_track_offset) ? track.tracklen : 0) + next_idam_offset - dam_track_offset;
            auto next_idam_bytes = (next_idam_distance >> shift) - 1;   // -1 due to DAM being read above
            auto next_idam_align = next_idam_distance & ((1 << shift) - 1);

            // Determine the bit offset and distance to the next DAM
            auto next_dam_offset = itDataNext->first;
            auto next_dam_distance = ((next_dam_offset <= dam_offset) ? bitbuf.size() : 0) + next_dam_offset - dam_offset;
            auto next_dam_bytes = (next_dam_distance >> shift) - 1;     // -1 due to DAM being read above

            // Attempt to read gap2 from non-final sectors, unless we're asked not to
            auto read_gap2 = !final_sector && (opt.gap2 != 0);

            // Calculate the extent of the current data field, up to the next header or data field (depending if gap2 is required)
            auto extent_bytes = read_gap2 ? next_dam_bytes : next_idam_bytes;
            if (extent_bytes >= 3 && sector.encoding == Encoding::MFM) extent_bytes -= 3;   // remove A1A1A1

            auto normal_bytes = sector.size() + 2;                  // data size + CRC bytes
            auto data_bytes = std::max(normal_bytes, extent_bytes); // data size needed to check CRC

            // Calculate bytes remaining in the data in current data encoding
            auto avail_bytes = bitbuf.remaining() >> shift;

            // Ignore truncated copies, unless it's the only copy we have
            if (avail_bytes < normal_bytes)
            {
                // If we've already got a copy, ignore the truncated version
                if (sector.copies() && (!sector.is_8k_sector() || avail_bytes < 0x1802))    // ToDo: fix nasty check
                {
                    if (opt.debug)
                        util::cout << "  s_b_mfm_fm ignoring truncated sector copy\n";
                    continue;
                }

                if (opt.debug)
                    util::cout << "  s_b_mfm_fm using truncated sector data as only copy\n";
            }

            // Read the full data field and check its CRC
            Data data(data_bytes);
            bitbuf.read(data);
            bool bad_crc = crc.add(data.data(), normal_bytes) != 0;
            if (opt.debug && bad_crc)
            {
                util::cout << util::fmt("  s_b_mfm_fm bad data CRC: %02X %02X, expected %02X %02X\n",
                    data[sector.size()], data[sector.size() + 1], crc.msb(), crc.lsb());
            }

            // Truncate at the extent size, unless we're asked to keep overlapping sectors
            if (!opt.keepoverlap && extent_bytes < sector.size())
                data.resize(extent_bytes);
            else if (data.size() > sector.size() && (opt.gaps == GAPS_NONE || (opt.gap4b == 0 && final_sector)))
                data.resize(sector.size());

            auto gap2_offset = next_idam_bytes + 1 + 4 + 2;
            auto has_gap2 = data.size() >= gap2_offset;
            auto has_gap3_4b = data.size() >= normal_bytes;
            auto remove_gap2 = false;
            auto remove_gap3_4b = false;

            // Check IDAM bit alignment and value, as AnglaisCollege\track00.0.raw has rogue FE junk on cyls 22+26
            if (has_gap2)
                remove_gap2 = next_idam_align != 0 || data[next_idam_bytes] != 0xfe || test_remove_gap2(data, gap2_offset);

            if (has_gap3_4b)
            {
                if (final_sector)
                    remove_gap3_4b = test_remove_gap4b(data, normal_bytes);
                else
                    remove_gap3_4b = test_remove_gap3(data, normal_bytes, sector.gap3);
            }

            if (opt.gaps != GAPS_ALL)
            {
                if (has_gap2 && remove_gap2)
                {
                    if (opt.debug)
                        util::cout << "  s_b_mfm_fm removing gap2 data\n";
                    data.resize(next_idam_bytes - ((sector.encoding == Encoding::MFM) ? 3 : 0));
                }
                else if (has_gap2)
                {
                    if (opt.debug)
                        util::cout << "  s_b_mfm_fm skipping gap2 removal\n";
                }

                if (has_gap3_4b && remove_gap3_4b && (!has_gap2 || remove_gap2))
                {
                    if (!final_sector)
                    {
                        if (opt.debug)
                            util::cout << "  s_b_mfm_fm removing gap3 data\n";
                        data.resize(sector.size());
                    }
                    else
                    {
                        if (opt.debug)
                            util::cout << "  s_b_mfm_fm removing gap4b data\n";
                        data.resize(sector.size());
                    }
                }
            }

            // If it's an 8K sector, attempt to validate any embedded checksum
            std::set<ChecksumType> chk8k_methods;
            if (sector.is_8k_sector())
            {
                chk8k_methods = ChecksumMethods(data.data(), data.size());
                if (opt.debug)
                    util::cout << "  s_b_mfm_fm chk8k_method = " << ChecksumName(chk8k_methods) << '\n';
            }

            // Consider good sectors overhanging the index
            if (final_sector && !bad_crc)
            {
                auto splice_offset = bitbuf.track_offset(dam_offset + (normal_bytes << shift));
                if (splice_offset < dam_offset)
                    bitbuf.splicepos(std::max(splice_offset, bitbuf.splicepos()));
            }

            sector.add(std::move(data), bad_crc, dam);

            // If the data is good there's no need to search for more data fields
            if (!bad_crc || !chk8k_methods.empty())
                break;
        }
    }

    trackdata.add(std::move(track));
}